

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QServ.cpp
# Opt level: O2

void __thiscall
server::QServ::newcommand
          (QServ *this,char *name,char *desc,int priv,_func_void_int_char_ptr_ptr_int *callback,
          int args)

{
  int iVar1;
  
  sprintf(this->m_command[this->m_lastcommand].name,"%c%s",(ulong)(uint)(int)this->m_cmdprefix,name)
  ;
  strcpy(this->m_command[this->m_lastcommand].desc,desc);
  iVar1 = this->m_lastcommand;
  this->m_command[iVar1].priv = priv;
  this->m_command[iVar1].id = iVar1;
  this->m_command[iVar1].func = callback;
  this->m_command[iVar1].args = args + 1;
  this->m_command[iVar1].hasargs = 0 < args;
  this->m_lastcommand = iVar1 + 1;
  return;
}

Assistant:

void QServ::newcommand(const char *name, const char *desc, int priv, void (*callback)(int, char **args, int),
                           int args) {
        sprintf(m_command[m_lastcommand].name, "%c%s", m_cmdprefix, name);
        sprintf(m_command[m_lastcommand].desc, "%s", desc);
        
        m_command[m_lastcommand].priv = priv;
        m_command[m_lastcommand].id = m_lastcommand;
        m_command[m_lastcommand].func = callback;
        m_command[m_lastcommand].args = args+1;
        
        if(args > 0) {
            m_command[m_lastcommand].hasargs = true;
        } else {
            m_command[m_lastcommand].hasargs = false;
        }
        
        m_lastcommand += 1;
    }